

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_batchnorm_scale(NetOptimize *this)

{
  float fVar1;
  float fVar2;
  int iVar3;
  value_type pLVar4;
  value_type pLVar5;
  FILE *__stream;
  bool bVar6;
  size_type sVar7;
  reference ppLVar8;
  reference pvVar9;
  size_type sVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  reference pvVar16;
  long in_RDI;
  int top_blob_index_final;
  int q;
  float *bias;
  float *slope;
  int channels;
  Scale *scale;
  BatchNorm *batchnorm;
  int j;
  int top_blob_index;
  int i;
  size_t layer_count;
  char *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int local_4c;
  int local_1c;
  int local_14;
  
  sVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
  local_14 = 0;
  do {
    if (sVar7 <= (ulong)(long)local_14) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
               (long)local_14);
    bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff78);
    if (!bVar6) {
      ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                           (long)local_14);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar8)->tops,0);
      iVar3 = *pvVar9;
      local_1c = local_14;
      do {
        do {
          do {
            local_1c = local_1c + 1;
            if (sVar7 <= (ulong)(long)local_1c) goto LAB_0011b7ab;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                       (long)local_1c);
            bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                                    ,in_stack_ffffffffffffff78);
          } while (bVar6);
          ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_1c);
          sVar10 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar8)->bottoms);
        } while (sVar10 != 1);
        ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_1c);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar8)->bottoms,0);
      } while (*pvVar9 != iVar3);
LAB_0011b7ab:
      if ((long)local_1c != sVar7) {
        ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_14);
        pLVar4 = *ppLVar8;
        ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_1c);
        __stream = _stderr;
        pLVar5 = *ppLVar8;
        uVar11 = std::__cxx11::string::c_str();
        uVar12 = std::__cxx11::string::c_str();
        fprintf(__stream,"fuse_batchnorm_scale %s %s\n",uVar11,uVar12);
        iVar3 = *(int *)&pLVar4[1]._vptr_Layer;
        pfVar13 = ncnn::Mat::operator_cast_to_float_((Mat *)&pLVar4[1].one_blob_only);
        pfVar14 = ncnn::Mat::operator_cast_to_float_((Mat *)&pLVar4[2].typeindex);
        for (local_4c = 0; local_4c < iVar3; local_4c = local_4c + 1) {
          fVar1 = pfVar13[local_4c];
          pfVar15 = ncnn::Mat::operator[]((Mat *)&pLVar5[1].one_blob_only,(long)local_4c);
          pfVar13[local_4c] = fVar1 * *pfVar15;
          if (*(int *)((long)&pLVar5[1]._vptr_Layer + 4) == 0) {
            fVar1 = pfVar14[local_4c];
            pfVar15 = ncnn::Mat::operator[]((Mat *)&pLVar5[1].one_blob_only,(long)local_4c);
            pfVar14[local_4c] = fVar1 * *pfVar15;
          }
          else {
            fVar1 = pfVar14[local_4c];
            pfVar15 = ncnn::Mat::operator[]((Mat *)&pLVar5[1].one_blob_only,(long)local_4c);
            fVar2 = *pfVar15;
            pfVar15 = ncnn::Mat::operator[]((Mat *)&pLVar5[1].name.field_2,(long)local_4c);
            pfVar14[local_4c] = fVar1 * fVar2 + *pfVar15;
          }
        }
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar5->tops,0);
        iVar3 = *pvVar9;
        in_stack_ffffffffffffff80 = iVar3;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar4->tops,0);
        *pvVar9 = in_stack_ffffffffffffff80;
        in_stack_ffffffffffffff84 = local_14;
        pvVar16 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),
                             (long)iVar3);
        pvVar16->producer = in_stack_ffffffffffffff84;
        std::__cxx11::string::operator=((string *)&pLVar5->type,"ncnnfused");
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_batchnorm_scale()
{
    const size_t layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "BatchNorm")
            continue;

        // BatchNorm - Scale
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "Scale")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse BatchNorm - Scale to BatchNorm
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[i];
        ncnn::Scale* scale = (ncnn::Scale*)layers[j];

        fprintf(stderr, "fuse_batchnorm_scale %s %s\n", batchnorm->name.c_str(), scale->name.c_str());

        {
//             v = ((v - mean) / sqrt(var + eps) * slope + bias) * s + b
//               =  (v - mean) / sqrt(var + eps) * (slope * s) + (bias * s + b)

            int channels = batchnorm->channels;

            float* slope = batchnorm->slope_data;
            float* bias = batchnorm->bias_data;

            for (int q=0; q<channels; q++)
            {
                slope[q] = slope[q] * scale->scale_data[q];
                if (scale->bias_term)
                    bias[q] = bias[q] * scale->scale_data[q] + scale->bias_data[q];
                else
                    bias[q] = bias[q] * scale->scale_data[q];
            }
        }

        int top_blob_index_final = scale->tops[0];
        batchnorm->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        scale->type = "ncnnfused";
    }

    return 0;
}